

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void * __thiscall vector<Edge>::realloc(vector<Edge> *this,void *__ptr,size_t __size)

{
  Edge *pEVar1;
  uint uVar2;
  void *in_RAX;
  ulong *puVar3;
  void *extraout_RAX;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  uVar2 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar2 = (uint)__ptr;
  }
  if (this->_capacity != uVar2) {
    lVar6 = (ulong)uVar2 * 0xc;
    puVar3 = (ulong *)operator_new__(lVar6 + 8);
    *puVar3 = (ulong)uVar2;
    lVar5 = 0;
    memset((Edge *)(puVar3 + 1),0,lVar6 - (lVar6 - 0xcU) % 0xc);
    pEVar1 = this->vect;
    uVar4 = 0;
    if (0 < this->_size) {
      uVar4 = (ulong)(uint)this->_size;
    }
    in_RAX = (void *)(uVar4 * 0xc);
    for (; (long)in_RAX - lVar5 != 0; lVar5 = lVar5 + 0xc) {
      *(undefined8 *)((long)puVar3 + lVar5 + 8) = *(undefined8 *)((long)&pEVar1->_nodeS + lVar5);
      *(undefined4 *)((long)puVar3 + lVar5 + 0x10) = *(undefined4 *)((long)&pEVar1->_cost + lVar5);
    }
    this->_capacity = uVar2;
    if (pEVar1 != (Edge *)0x0) {
      operator_delete__(&pEVar1[-1]._nodeD);
      in_RAX = extraout_RAX;
    }
    this->vect = (Edge *)(puVar3 + 1);
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}